

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

char * aux_upvalue(StkId fi,int n,TValue **val)

{
  GCObject *pGVar1;
  global_State *pgVar2;
  
  if (fi->tt == 6) {
    pGVar1 = (fi->value).gc;
    if ((pGVar1->h).flags == '\0') {
      if ((0 < n) && (pgVar2 = (pGVar1->th).l_G, n <= *(int *)&pgVar2->weak)) {
        *val = *(TValue **)(*(long *)((long)pGVar1 + (ulong)(n - 1) * 8 + 0x28) + 0x10);
        return (char *)(*(long *)((long)pgVar2->gray + (ulong)(n - 1) * 8) + 0x18);
      }
    }
    else if ((0 < n) && ((uint)n <= (uint)(pGVar1->h).lsizenode)) {
      *val = (TValue *)((long)pGVar1 + (ulong)(n - 1) * 0x10 + 0x28);
      return "";
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *aux_upvalue (StkId fi, int n, TValue **val) {
  Closure *f;
  if (!ttisfunction(fi)) return NULL;
  f = clvalue(fi);
  if (f->c.isC) {
    if (!(1 <= n && n <= f->c.nupvalues)) return NULL;
    *val = &f->c.upvalue[n-1];
    return "";
  }
  else {
    Proto *p = f->l.p;
    if (!(1 <= n && n <= p->sizeupvalues)) return NULL;
    *val = f->l.upvals[n-1]->v;
    return getstr(p->upvalues[n-1]);
  }
}